

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O3

void __thiscall
helix::parity::pmd_handler::subscribe(pmd_handler *this,string *sym,size_t max_orders)

{
  pointer pcVar1;
  ulong uVar2;
  order_book ob;
  string local_128;
  order_book local_108;
  
  pcVar1 = (sym->_M_dataplus)._M_p;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar1,pcVar1 + sym->_M_string_length);
  order_book::order_book(&local_108,&local_128,0,max_orders);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_108._state = trading;
  uVar2 = sym->_M_string_length;
  if (uVar2 != 8) {
    std::__cxx11::string::insert((ulong)sym,uVar2,'\b' - (char)uVar2);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->_symbols,sym);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,helix::order_book>,std::allocator<std::pair<std::__cxx11::string_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,helix::order_book>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,helix::order_book>,std::allocator<std::pair<std::__cxx11::string_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->_order_book_id_map,sym,&local_108);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  ::~_Rb_tree(&local_108._asks._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  ::~_Rb_tree(&local_108._bids._M_t);
  boost::multi_index::
  multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
  ::~multi_index_container(&local_108._orders);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._symbol._M_dataplus._M_p != &local_108._symbol.field_2) {
    operator_delete(local_108._symbol._M_dataplus._M_p,
                    local_108._symbol.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void pmd_handler::subscribe(std::string sym, size_t max_orders)
{
    helix::order_book ob{sym, 0, max_orders};
    ob.set_state(trading_state::trading);
    auto padding = PMD_INSTRUMENT_LEN - sym.size();
    if (padding > 0) {
        sym.insert(sym.size(), padding, ' ');
    }
    _symbols.insert(sym);
    _order_book_id_map.emplace(sym, std::move(ob));
}